

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O1

int WebPWriteTIFF(FILE *fout,WebPDecBuffer *buffer)

{
  WEBP_CSP_MODE WVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  uint8_t *__ptr;
  bool bVar8;
  undefined4 local_118;
  undefined1 local_114;
  uint local_113;
  undefined2 local_10f;
  undefined7 local_10d;
  undefined1 uStack_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined4 uStack_102;
  undefined1 local_fe;
  int local_fd;
  undefined1 local_f9;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined2 local_f6;
  undefined1 local_f4;
  int local_f3;
  undefined1 local_ef;
  undefined8 local_ee;
  undefined8 uStack_e6;
  undefined8 local_de;
  undefined8 uStack_d6;
  undefined8 local_ce;
  undefined8 uStack_c6;
  undefined8 local_be;
  undefined1 local_b6;
  int local_b5;
  undefined7 uStack_b1;
  undefined1 local_aa;
  int local_a9;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined4 uStack_a2;
  undefined1 local_9e;
  int local_9d;
  undefined1 local_99;
  undefined1 local_98;
  undefined1 local_97;
  undefined8 local_96;
  undefined8 uStack_8e;
  undefined8 local_86;
  undefined8 uStack_7e;
  undefined8 local_76;
  undefined8 uStack_6e;
  undefined4 local_66;
  undefined1 local_62;
  int local_61;
  undefined4 uStack_5d;
  undefined3 uStack_59;
  undefined8 local_56;
  undefined8 uStack_4e;
  long local_38;
  
  local_118 = 0x2a4949;
  local_114 = 8;
  local_10f = 0;
  local_10d = 0x1000301;
  uStack_102 = 0x30101;
  local_fe = 1;
  local_f6 = 0x102;
  local_f4 = 3;
  local_ef = 0;
  local_ee = 0x30103000000c2;
  uStack_e6 = 0x100000001;
  local_de = 0x100030106;
  uStack_d6 = 0x4011100000002;
  local_ce = 0xd200000001;
  uStack_c6 = 0x100030112;
  local_be = 0x3011500000001;
  local_b6 = 1;
  uStack_b1 = 0x30116000000;
  local_aa = 1;
  uStack_a2 = 0x40117;
  local_9e = 1;
  local_96 = 0x10005011a;
  uStack_8e = 0x5011b000000ca;
  local_86 = 0xca00000001;
  uStack_7e = 0x10003011c;
  local_76 = 0x3012800000001;
  uStack_6e = 0x200000001;
  local_66 = 0x30152;
  local_62 = 1;
  uStack_59 = 0;
  uStack_5d = 0;
  local_56 = 0x8000800080008;
  uStack_4e = 0x100000048;
  iVar5 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    WVar1 = buffer->colorspace;
    if ((WVar1 - MODE_RGBA < 0xc) && ((0x81dU >> (WVar1 - MODE_RGBA & 0x1f) & 1) != 0)) {
      bVar8 = false;
    }
    else {
      bVar8 = WVar1 - MODE_YUV < 0xfffffffc;
    }
    __ptr = (buffer->u).RGBA.rgba;
    iVar5 = 0;
    if (__ptr != (uint8_t *)0x0) {
      uVar2 = buffer->width;
      iVar7 = buffer->height;
      local_38 = (long)(buffer->u).RGBA.stride;
      bVar6 = 4 - bVar8;
      local_b5 = (uint)bVar6 << 0x18;
      local_f3 = (uint)bVar6 << 8;
      local_113 = (uint)bVar8 << 0x18 ^ 0xf000000;
      iVar5 = 0;
      local_61 = (uint)(byte)((WVar1 - MODE_YUV < 0xfffffffc) + 1) << 0x18;
      uStack_106 = (undefined1)uVar2;
      local_105 = (undefined1)(uVar2 >> 8);
      local_104 = (undefined1)(uVar2 >> 0x10);
      local_103 = (undefined1)(uVar2 >> 0x18);
      local_fd = iVar7 << 0x18;
      local_f9 = (undefined1)((uint)iVar7 >> 8);
      local_f8 = (undefined1)((uint)iVar7 >> 0x10);
      local_f7 = (undefined1)((uint)iVar7 >> 0x18);
      local_a9 = iVar7 << 0x18;
      iVar3 = (4 - (uint)bVar8) * uVar2 * iVar7;
      local_9d = iVar3 * 0x1000000;
      local_99 = (undefined1)((uint)iVar3 >> 8);
      local_98 = (undefined1)((uint)iVar3 >> 0x10);
      local_97 = (undefined1)((uint)iVar3 >> 0x18);
      if (bVar8 != false) {
        local_66 = 0;
      }
      uStack_a5 = local_f9;
      uStack_a4 = local_f8;
      uStack_a3 = local_f7;
      sVar4 = fwrite(&local_118,0xd2,1,(FILE *)fout);
      if (sVar4 == 1) {
        if (iVar7 != 0) {
          do {
            sVar4 = fwrite(__ptr,(ulong)bVar6,(ulong)uVar2,(FILE *)fout);
            if (sVar4 != uVar2) {
              return 0;
            }
            __ptr = __ptr + local_38;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int WebPWriteTIFF(FILE* fout, const WebPDecBuffer* const buffer) {
  int has_alpha;
  uint32_t width, height;
  uint8_t* rgba;
  int stride;
  uint8_t bytes_per_px = 0;
  const uint8_t assoc_alpha = 0;
  // For non-alpha case, we omit tag 0x152 (ExtraSamples).
  const uint8_t num_ifd_entries = 0;
  uint8_t tiff_header[TIFF_HEADER_SIZE] = {
    0x49, 0x49, 0x2a, 0x00,   // little endian signature
    8, 0, 0, 0,               // offset to the unique IFD that follows
    // IFD (offset = 8). Entries must be written in increasing tag order.
    num_ifd_entries, 0,       // Number of entries in the IFD (12 bytes each).
    0x00, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    //  10: Width  (TBD)
    0x01, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    //  22: Height (TBD)
    0x02, 0x01, 3, 0, bytes_per_px, 0, 0, 0,     //  34: BitsPerSample: 8888
        EXTRA_DATA_OFFSET + 0, 0, 0, 0,
    0x03, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    //  46: Compression: none
    0x06, 0x01, 3, 0, 1, 0, 0, 0, 2, 0, 0, 0,    //  58: Photometric: RGB
    0x11, 0x01, 4, 0, 1, 0, 0, 0,                //  70: Strips offset:
        TIFF_HEADER_SIZE, 0, 0, 0,               //      data follows header
    0x12, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    //  82: Orientation: topleft
    0x15, 0x01, 3, 0, 1, 0, 0, 0,                //  94: SamplesPerPixels
        bytes_per_px, 0, 0, 0,
    0x16, 0x01, 3, 0, 1, 0, 0, 0, 0, 0, 0, 0,    // 106: Rows per strip (TBD)
    0x17, 0x01, 4, 0, 1, 0, 0, 0, 0, 0, 0, 0,    // 118: StripByteCount (TBD)
    0x1a, 0x01, 5, 0, 1, 0, 0, 0,                // 130: X-resolution
        EXTRA_DATA_OFFSET + 8, 0, 0, 0,
    0x1b, 0x01, 5, 0, 1, 0, 0, 0,                // 142: Y-resolution
        EXTRA_DATA_OFFSET + 8, 0, 0, 0,
    0x1c, 0x01, 3, 0, 1, 0, 0, 0, 1, 0, 0, 0,    // 154: PlanarConfiguration
    0x28, 0x01, 3, 0, 1, 0, 0, 0, 2, 0, 0, 0,    // 166: ResolutionUnit (inch)
    0x52, 0x01, 3, 0, 1, 0, 0, 0,
        assoc_alpha, 0, 0, 0,                    // 178: ExtraSamples: rgbA/RGBA
    0, 0, 0, 0,                                  // 190: IFD terminator
    // EXTRA_DATA_OFFSET:
    8, 0, 8, 0, 8, 0, 8, 0,      // BitsPerSample
    72, 0, 0, 0, 1, 0, 0, 0      // 72 pixels/inch, for X/Y-resolution
  };
  uint32_t y;

  if (fout == NULL || buffer == NULL) return 0;

  has_alpha = WebPIsAlphaMode(buffer->colorspace);
  width = buffer->width;
  height = buffer->height;
  rgba = buffer->u.RGBA.rgba;
  stride = buffer->u.RGBA.stride;

  if (rgba == NULL) return 0;

  // Update bytes_per_px, num_ifd_entries and assoc_alpha.
  tiff_header[38] = tiff_header[102] = bytes_per_px = has_alpha ? 4 : 3;
  tiff_header[8] = has_alpha ? NUM_IFD_ENTRIES : NUM_IFD_ENTRIES - 1;
  tiff_header[186] = WebPIsPremultipliedMode(buffer->colorspace) ? 1 : 2;

  // Fill placeholders in IFD:
  PutLE32(tiff_header + 10 + 8, width);
  PutLE32(tiff_header + 22 + 8, height);
  PutLE32(tiff_header + 106 + 8, height);
  PutLE32(tiff_header + 118 + 8, width * bytes_per_px * height);
  if (!has_alpha) PutLE32(tiff_header + 178, 0);  // IFD terminator

  // write header
  if (fwrite(tiff_header, sizeof(tiff_header), 1, fout) != 1) {
    return 0;
  }
  // write pixel values
  for (y = 0; y < height; ++y) {
    if (fwrite(rgba, bytes_per_px, width, fout) != width) {
      return 0;
    }
    rgba += stride;
  }

  return 1;
}